

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2f::BuildLogRecompactTestRecompact::Run(BuildLogRecompactTestRecompact *this)

{
  BuildLogUser *user;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Test *pTVar3;
  bool bVar4;
  int iVar5;
  LogEntry *pLVar6;
  BuildLog log3;
  string err;
  BuildLog log2;
  BuildLog log1;
  string local_148;
  undefined1 local_128 [72];
  string local_e0;
  undefined1 local_c0 [72];
  BuildLog local_78;
  
  AssertParse(&(this->super_BuildLogRecompactTest).super_BuildLogTest.
               super_StateTestWithBuiltinRules.state_,"build out: cat in\nbuild out2: cat in\n",
              (ManifestParserOptions)0x0);
  BuildLog::BuildLog(&local_78);
  pTVar3 = g_current_test;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_c0._0_8_ = local_c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"BuildLogTest-tempfile","");
  user = &(this->super_BuildLogRecompactTest).super_BuildLogTest.super_BuildLogUser;
  bVar4 = BuildLog::OpenForWrite(&local_78,(string *)local_c0,user,&local_e0);
  testing::Test::Check
            (pTVar3,bVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
             ,0x116,"log1.OpenForWrite(kTestFilename, *this, &err)");
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  pTVar3 = g_current_test;
  iVar5 = std::__cxx11::string::compare((char *)&local_e0);
  bVar4 = testing::Test::Check
                    (pTVar3,iVar5 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                     ,0x117,"\"\" == err");
  if (!bVar4) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_0011ea50;
  }
  iVar5 = 0x12;
  do {
    BuildLog::RecordCommand
              (&local_78,
               *(this->super_BuildLogRecompactTest).super_BuildLogTest.
                super_StateTestWithBuiltinRules.state_.edges_.
                super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data.
                _M_start,0xf,iVar5,0);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0xda);
  BuildLog::RecordCommand
            (&local_78,
             (this->super_BuildLogRecompactTest).super_BuildLogTest.super_StateTestWithBuiltinRules.
             state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start[1],0x15,0x16,0);
  BuildLog::Close(&local_78);
  BuildLog::BuildLog((BuildLog *)local_c0);
  pTVar3 = g_current_test;
  pcVar1 = local_128 + 0x10;
  local_128._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"BuildLogTest-tempfile","");
  bVar4 = BuildLog::Load((BuildLog *)local_c0,(string *)local_128,&local_e0);
  testing::Test::Check
            (pTVar3,bVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
             ,0x121,"log2.Load(kTestFilename, &err)");
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  pTVar3 = g_current_test;
  iVar5 = std::__cxx11::string::compare((char *)&local_e0);
  bVar4 = testing::Test::Check
                    (pTVar3,iVar5 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                     ,0x122,"\"\" == err");
  if (bVar4) {
    bVar4 = testing::Test::Check
                      (g_current_test,local_c0._24_8_ == 2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                       ,0x123,"2u == log2.entries().size()");
    pTVar3 = g_current_test;
    if (bVar4) {
      local_128._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"out","");
      pLVar6 = BuildLog::LookupByOutput((BuildLog *)local_c0,(string *)local_128);
      bVar4 = testing::Test::Check
                        (pTVar3,pLVar6 != (LogEntry *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                         ,0x124,"log2.LookupByOutput(\"out\")");
      if ((pointer)local_128._0_8_ != pcVar1) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      pTVar3 = g_current_test;
      if (bVar4) {
        local_128._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"out2","");
        pLVar6 = BuildLog::LookupByOutput((BuildLog *)local_c0,(string *)local_128);
        bVar4 = testing::Test::Check
                          (pTVar3,pLVar6 != (LogEntry *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                           ,0x125,"log2.LookupByOutput(\"out2\")");
        if ((pointer)local_128._0_8_ != pcVar1) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        pTVar3 = g_current_test;
        if (bVar4) {
          local_128._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_128,"BuildLogTest-tempfile","");
          bVar4 = BuildLog::OpenForWrite((BuildLog *)local_c0,(string *)local_128,user,&local_e0);
          testing::Test::Check
                    (pTVar3,bVar4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                     ,0x127,"log2.OpenForWrite(kTestFilename, *this, &err)");
          if ((pointer)local_128._0_8_ != pcVar1) {
            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
          }
          BuildLog::Close((BuildLog *)local_c0);
          BuildLog::BuildLog((BuildLog *)local_128);
          pTVar3 = g_current_test;
          paVar2 = &local_148.field_2;
          local_148._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,"BuildLogTest-tempfile","");
          bVar4 = BuildLog::Load((BuildLog *)local_c0,&local_148,&local_e0);
          testing::Test::Check
                    (pTVar3,bVar4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                     ,300,"log2.Load(kTestFilename, &err)");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          pTVar3 = g_current_test;
          iVar5 = std::__cxx11::string::compare((char *)&local_e0);
          bVar4 = testing::Test::Check
                            (pTVar3,iVar5 == 0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                             ,0x12d,"\"\" == err");
          if ((bVar4) &&
             (bVar4 = testing::Test::Check
                                (g_current_test,local_c0._24_8_ == 1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                                 ,0x12e,"1u == log2.entries().size()"), pTVar3 = g_current_test,
             bVar4)) {
            local_148._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"out","");
            pLVar6 = BuildLog::LookupByOutput((BuildLog *)local_c0,&local_148);
            bVar4 = testing::Test::Check
                              (pTVar3,pLVar6 != (LogEntry *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                               ,0x12f,"log2.LookupByOutput(\"out\")");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            pTVar3 = g_current_test;
            if (!bVar4) goto LAB_0011ea22;
            local_148._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"out2","");
            pLVar6 = BuildLog::LookupByOutput((BuildLog *)local_c0,&local_148);
            bVar4 = testing::Test::Check
                              (pTVar3,pLVar6 == (LogEntry *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                               ,0x130,"log2.LookupByOutput(\"out2\")");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if (!bVar4) goto LAB_0011ea22;
          }
          else {
LAB_0011ea22:
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          }
          BuildLog::~BuildLog((BuildLog *)local_128);
          goto LAB_0011ea43;
        }
      }
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
LAB_0011ea43:
  BuildLog::~BuildLog((BuildLog *)local_c0);
LAB_0011ea50:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  BuildLog::~BuildLog(&local_78);
  return;
}

Assistant:

TEST_F(BuildLogRecompactTest, Recompact) {
  AssertParse(&state_,
"build out: cat in\n"
"build out2: cat in\n");

  BuildLog log1;
  string err;
  EXPECT_TRUE(log1.OpenForWrite(kTestFilename, *this, &err));
  ASSERT_EQ("", err);
  // Record the same edge several times, to trigger recompaction
  // the next time the log is opened.
  for (int i = 0; i < 200; ++i)
    log1.RecordCommand(state_.edges_[0], 15, 18 + i);
  log1.RecordCommand(state_.edges_[1], 21, 22);
  log1.Close();

  // Load...
  BuildLog log2;
  EXPECT_TRUE(log2.Load(kTestFilename, &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(2u, log2.entries().size());
  ASSERT_TRUE(log2.LookupByOutput("out"));
  ASSERT_TRUE(log2.LookupByOutput("out2"));
  // ...and force a recompaction.
  EXPECT_TRUE(log2.OpenForWrite(kTestFilename, *this, &err));
  log2.Close();

  // "out2" is dead, it should've been removed.
  BuildLog log3;
  EXPECT_TRUE(log2.Load(kTestFilename, &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, log2.entries().size());
  ASSERT_TRUE(log2.LookupByOutput("out"));
  ASSERT_FALSE(log2.LookupByOutput("out2"));
}